

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilSort.c
# Opt level: O3

void Abc_MergeSortCost_rec(int *pInBeg,int *pInEnd,int *pOutBeg)

{
  ulong uVar1;
  int *pInEnd_00;
  int iVar2;
  undefined8 uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  
  uVar9 = (uint)(((long)pInEnd - (long)pInBeg >> 2) - ((long)pInEnd - (long)pInBeg >> 0x3f) >> 1);
  if ((int)uVar9 < 1) {
    __assert_fail("nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilSort.c"
                  ,0xba,"void Abc_MergeSortCost_rec(int *, int *, int *)");
  }
  if (uVar9 != 1) {
    if (uVar9 == 2) {
      iVar2 = pInBeg[3];
      if (iVar2 < pInBeg[1]) {
        pInBeg[3] = pInBeg[1];
        pInBeg[1] = iVar2;
        iVar2 = pInBeg[2];
        pInBeg[2] = *pInBeg;
        *pInBeg = iVar2;
      }
    }
    else {
      if (7 < uVar9) {
        pInEnd_00 = pInBeg + (uVar9 & 0x7ffffffe);
        Abc_MergeSortCost_rec(pInBeg,pInEnd_00,pOutBeg);
        Abc_MergeSortCost_rec(pInEnd_00,pInEnd,pOutBeg + (uVar9 & 0x7ffffffe));
        Abc_MergeSortCostMerge(pInBeg,pInEnd_00,pInEnd_00,pInEnd,pOutBeg);
        memcpy(pInBeg,pOutBeg,(ulong)(uVar9 & 0x7fffffff) << 3);
        return;
      }
      uVar5 = 1;
      uVar6 = 0;
      do {
        uVar1 = uVar6 + 1;
        uVar8 = uVar6 & 0xffffffff;
        uVar7 = uVar5;
        do {
          uVar4 = uVar7 & 0xffffffff;
          if (pInBeg[(int)uVar8 * 2 + 1] <= pInBeg[uVar7 * 2 + 1]) {
            uVar4 = uVar8;
          }
          uVar8 = uVar4;
          uVar7 = uVar7 + 1;
        } while ((uVar9 & 7) != uVar7);
        iVar2 = (int)uVar8 * 2;
        uVar3 = *(undefined8 *)(pInBeg + uVar6 * 2);
        *(undefined8 *)(pInBeg + uVar6 * 2) = *(undefined8 *)(pInBeg + iVar2);
        *(undefined8 *)(pInBeg + iVar2) = uVar3;
        uVar5 = uVar5 + 1;
        uVar6 = uVar1;
      } while (uVar1 != uVar9 - 1);
    }
  }
  return;
}

Assistant:

void Abc_MergeSortCost_rec( int * pInBeg, int * pInEnd, int * pOutBeg )
{
    int nSize = (pInEnd - pInBeg)/2;
    assert( nSize > 0 );
    if ( nSize == 1 )
        return;
    if ( nSize == 2 )
    {
         if ( pInBeg[1] > pInBeg[3] )
         {
             pInBeg[1] ^= pInBeg[3];
             pInBeg[3] ^= pInBeg[1];
             pInBeg[1] ^= pInBeg[3];
             pInBeg[0] ^= pInBeg[2];
             pInBeg[2] ^= pInBeg[0];
             pInBeg[0] ^= pInBeg[2];
         }
    }
    else if ( nSize < 8 )
    {
        int temp, i, j, best_i;
        for ( i = 0; i < nSize-1; i++ )
        {
            best_i = i;
            for ( j = i+1; j < nSize; j++ )
                if ( pInBeg[2*j+1] < pInBeg[2*best_i+1] )
                    best_i = j;
            temp = pInBeg[2*i]; 
            pInBeg[2*i] = pInBeg[2*best_i]; 
            pInBeg[2*best_i] = temp;
            temp = pInBeg[2*i+1]; 
            pInBeg[2*i+1] = pInBeg[2*best_i+1]; 
            pInBeg[2*best_i+1] = temp;
        }
    }
    else
    {
        Abc_MergeSortCost_rec( pInBeg, pInBeg + 2*(nSize/2), pOutBeg );
        Abc_MergeSortCost_rec( pInBeg + 2*(nSize/2), pInEnd, pOutBeg + 2*(nSize/2) );
        Abc_MergeSortCostMerge( pInBeg, pInBeg + 2*(nSize/2), pInBeg + 2*(nSize/2), pInEnd, pOutBeg );
        memcpy( pInBeg, pOutBeg, sizeof(int) * 2 * nSize );
    }
}